

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::drop_all_pending_commit_elems(raft_server *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr this_00;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  _Node *p_Var6;
  _Base_ptr p_Var7;
  uint64_t uVar8;
  _Rb_tree_node_base *p_Var9;
  _List_node_base *p_Var10;
  ulong uVar11;
  ulong uVar12;
  ptr<buffer> result;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  elems;
  undefined1 local_99;
  string local_98;
  pthread_mutex_t *local_78;
  _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  local_70;
  runtime_error *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<std::exception> local_48;
  ulong local_38;
  
  context::get_params((context *)&local_98);
  iVar5 = *(int *)(local_98._M_dataplus._M_p + 0x58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
  }
  if (iVar5 == 0) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    uVar12 = 0xffffffffffffffff;
    p_Var9 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_78 = (pthread_mutex_t *)&this->commit_ret_elems_lock_;
    uVar4 = 0;
    while ((_Rb_tree_header *)p_Var9 !=
           &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = p_Var9[1]._M_parent;
      p_Var7[5]._M_parent = (_Base_ptr)0x0;
      this_00 = p_Var7[5]._M_left;
      p_Var7[5]._M_left = (_Base_ptr)0x0;
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var7 = p_Var9[1]._M_parent;
      *(undefined4 *)&p_Var7[5]._M_right = 0xffffffff;
      EventAwaiter::invoke((EventAwaiter *)&p_Var7->_M_parent);
      uVar11 = *(ulong *)p_Var9[1]._M_parent;
      if (uVar11 <= uVar12) {
        uVar12 = uVar11;
      }
      if (uVar11 < uVar4) {
        uVar11 = uVar4;
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 4 < iVar5)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = *(undefined8 *)p_Var9[1]._M_parent;
        local_38 = uVar12;
        uVar8 = timer_helper::get_us((timer_helper *)&p_Var9[1]._M_parent[3]._M_parent);
        msg_if_given_abi_cxx11_
                  (&local_98,"cancelled blocking client request %lu, waited %lu us",uVar3,uVar8);
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"drop_all_pending_commit_elems",0x119,&local_98);
        uVar12 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
          uVar12 = local_38;
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      uVar4 = uVar11;
    }
    if ((((this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
        (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar2 != (element_type *)0x0)) &&
       (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_98,"cancelled %zu blocking client requests from %lu to %lu.",
                 (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count,uVar12,
                 uVar4);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"drop_all_pending_commit_elems",0x11e,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&(this->commit_ret_elems_)._M_t);
    pthread_mutex_unlock(local_78);
  }
  else {
    local_70._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_70;
    local_70._M_impl._M_node._M_size = 0;
    local_70._M_impl._M_node.super__List_node_base._M_prev =
         local_70._M_impl._M_node.super__List_node_base._M_next;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    p_Var7 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        p_Var6 = std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                 ::_M_create_node<std::shared_ptr<nuraft::raft_server::commit_ret_elem>const&>
                           ((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                             *)&local_70,
                            (shared_ptr<nuraft::raft_server::commit_ret_elem> *)&p_Var7[1]._M_parent
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        local_70._M_impl._M_node._M_size = local_70._M_impl._M_node._M_size + 1;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&(this->commit_ret_elems_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    if (local_70._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_70) {
      p_Var10 = local_70._M_impl._M_node.super__List_node_base._M_next;
      do {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar2 != (element_type *)0x0) &&
           (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar5)) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_98,"cancelled non-blocking client request %lu",
                     (p_Var10[1]._M_next)->_M_next);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x133,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_98._M_string_length = 0;
        local_58 = (runtime_error *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::runtime_error,std::allocator<std::runtime_error>,char_const(&)[19]>
                  (&_Stack_50,&local_58,(allocator<std::runtime_error> *)&local_99,
                   (char (*) [19])"Request cancelled.");
        local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_58;
        local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Stack_50._M_pi;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   p_Var10[1]._M_next[0xc]._M_next,(shared_ptr<nuraft::buffer> *)&local_98,&local_48
                   ,CANCELLED);
        if (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
        }
        p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var10 != (_List_node_base *)&local_70);
    }
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::_M_clear(&local_70);
  }
  return;
}

Assistant:

void raft_server::drop_all_pending_commit_elems() {
    // Blocking mode:
    //   Invoke all awaiting requests to return `CANCELLED`.
    if (ctx_->get_params()->return_method_ == raft_params::blocking) {
        auto_lock(commit_ret_elems_lock_);
        ulong min_idx = std::numeric_limits<ulong>::max();
        ulong max_idx = 0;
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& elem = entry.second;
            elem->ret_value_ = nullptr;
            elem->result_code_ = cmd_result_code::CANCELLED;
            elem->awaiter_.invoke();
            if (min_idx > elem->idx_) {
                min_idx = elem->idx_;
            }
            if (max_idx < elem->idx_) {
                max_idx = elem->idx_;
            }
            p_db("cancelled blocking client request %" PRIu64 ", waited %" PRIu64 " us",
                 elem->idx_, elem->timer_.get_us());
        }
        if (!commit_ret_elems_.empty()) {
            p_wn("cancelled %zu blocking client requests from %" PRIu64
                 " to %" PRIu64 ".",
                 commit_ret_elems_.size(), min_idx, max_idx);
        }
        commit_ret_elems_.clear();
        return;
    }

    // Non-blocking mode:
    //   Set `CANCELLED` and set result & error.
    std::list< ptr<commit_ret_elem> > elems;

    {   auto_lock(commit_ret_elems_lock_);
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& ee = entry.second;
            elems.push_back(ee);
        }
        commit_ret_elems_.clear();
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: elems) {
        ptr<commit_ret_elem>&ee = entry;
        p_wn("cancelled non-blocking client request %" PRIu64, ee->idx_);

        ptr<buffer> result = nullptr;
        ptr<std::exception> err =
            cs_new<std::runtime_error>("Request cancelled.");
        ee->async_result_->set_result(result, err, cmd_result_code::CANCELLED);
    }
}